

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O3

Abc_Ntk_t * Bbl_ManToAbc(Bbl_Man_t *p)

{
  uint uVar1;
  Mem_Flex_t *pMan;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  Vec_Ptr_t *p_00;
  void **ppvVar5;
  Bbl_Obj_t *pBVar6;
  Abc_Obj_t *pAVar7;
  Bbl_Obj_t *p_01;
  Abc_ObjType_t Type;
  
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar4 = Bbl_ManName(p);
  pcVar4 = Extra_UtilStrsav(pcVar4);
  pNtk->pName = pcVar4;
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  p_00->nCap = 1000;
  ppvVar5 = (void **)calloc(1,8000);
  p_00->pArray = ppvVar5;
  p_00->nSize = 1000;
  for (pBVar6 = Bbl_ManObjFirst(p); pBVar6 != (Bbl_Obj_t *)0x0; pBVar6 = Bbl_ManObjNext(p,pBVar6)) {
    iVar2 = Bbl_ObjIsInput(pBVar6);
    Type = ABC_OBJ_PI;
    if (iVar2 == 0) {
      iVar2 = Bbl_ObjIsOutput(pBVar6);
      Type = ABC_OBJ_PO;
      if (iVar2 == 0) {
        iVar2 = Bbl_ObjIsLut(pBVar6);
        Type = ABC_OBJ_NODE;
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadBblif.c"
                        ,0x4a,"Abc_Ntk_t *Bbl_ManToAbc(Bbl_Man_t *)");
        }
      }
    }
    pAVar7 = Abc_NtkCreateObj(pNtk,Type);
    iVar2 = Bbl_ObjIsLut(pBVar6);
    if (iVar2 != 0) {
      pMan = (Mem_Flex_t *)pNtk->pManFunc;
      pcVar4 = Bbl_ObjSop(p,pBVar6);
      pcVar4 = Abc_SopRegister(pMan,pcVar4);
      (pAVar7->field_5).pData = pcVar4;
    }
    iVar2 = Bbl_ObjId(pBVar6);
    Vec_PtrSetEntry(p_00,iVar2,pAVar7);
  }
  pBVar6 = Bbl_ManObjFirst(p);
  do {
    if (pBVar6 == (Bbl_Obj_t *)0x0) {
      if (p_00->pArray != (void **)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      Abc_NtkAddDummyPiNames(pNtk);
      Abc_NtkAddDummyPoNames(pNtk);
      iVar2 = Abc_NtkCheck(pNtk);
      if (iVar2 == 0) {
        puts("Bbl_ManToAbc(): Network check has failed.");
      }
      return pNtk;
    }
    for (p_01 = Bbl_ObjFaninFirst(pBVar6); p_01 != (Bbl_Obj_t *)0x0;
        p_01 = Bbl_ObjFaninNext(pBVar6,p_01)) {
      uVar3 = Bbl_ObjId(pBVar6);
      if (((int)uVar3 < 0) || (uVar1 = p_00->nSize, (int)uVar1 <= (int)uVar3)) {
LAB_0089adeb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppvVar5 = p_00->pArray;
      pAVar7 = (Abc_Obj_t *)ppvVar5[uVar3];
      uVar3 = Bbl_ObjId(p_01);
      if (((int)uVar3 < 0) || (uVar1 <= uVar3)) goto LAB_0089adeb;
      Abc_ObjAddFanin(pAVar7,(Abc_Obj_t *)ppvVar5[uVar3]);
    }
    pBVar6 = Bbl_ManObjNext(p,pBVar6);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


// For description of Binary BLIF format, refer to "abc/src/aig/bbl/bblif.h"

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Fnction*************************************************************

  Synopsis    [Constructs ABC network from the manager.]

  Description [The ABC network is started, as well as the array vCopy,
  which will map the new ID of each object in the BBLIF manager into
  the ponter ot the corresponding object in the ABC. For each internal
  node, determined by Bbl_ObjIsLut(), the SOP representation is created
  by retrieving the SOP representation of the BBLIF object. Finally,
  the objects are connected using fanin/fanout creation, and the dummy
  names are assigned because ABC requires each CI/CO to have a name.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Bbl_ManToAbc( Bbl_Man_t * p )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObjNew = NULL;
    Bbl_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vCopy;
    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtk->pName = Extra_UtilStrsav( Bbl_ManName(p) );
    // create objects
    vCopy = Vec_PtrStart( 1000 );
    Bbl_ManForEachObj( p, pObj )
    {
        if ( Bbl_ObjIsInput(pObj) )
            pObjNew = Abc_NtkCreatePi( pNtk );
        else if ( Bbl_ObjIsOutput(pObj) )
            pObjNew = Abc_NtkCreatePo( pNtk );
        else if ( Bbl_ObjIsLut(pObj) )
            pObjNew = Abc_NtkCreateNode( pNtk );
        else assert( 0 );
        if ( Bbl_ObjIsLut(pObj) )
            pObjNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, Bbl_ObjSop(p, pObj) );
        Vec_PtrSetEntry( vCopy, Bbl_ObjId(pObj), pObjNew );
    }
    // connect objects
    Bbl_ManForEachObj( p, pObj )
        Bbl_ObjForEachFanin( pObj, pFanin )
            Abc_ObjAddFanin( (Abc_Obj_t *)Vec_PtrEntry(vCopy, Bbl_ObjId(pObj)), (Abc_Obj_t *)Vec_PtrEntry(vCopy, Bbl_ObjId(pFanin)) );
    // finalize
    Vec_PtrFree( vCopy );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    if ( !Abc_NtkCheck( pNtk ) )
        printf( "Bbl_ManToAbc(): Network check has failed.\n" );
    return pNtk;
}